

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# View.cpp
# Opt level: O1

void __thiscall sf::View::View(View *this,FloatRect *rectangle)

{
  float fVar1;
  float fVar2;
  
  *(undefined8 *)&(this->m_size).y = 0;
  (this->m_viewport).left = 0.0;
  (this->m_viewport).top = 0.0;
  (this->m_center).x = 0.0;
  (this->m_center).y = 0.0;
  (this->m_size).x = 0.0;
  (this->m_size).y = 0.0;
  (this->m_viewport).width = 1.0;
  (this->m_viewport).height = 1.0;
  Transform::Transform(&this->m_transform);
  Transform::Transform(&this->m_inverseTransform);
  this->m_transformUpdated = false;
  this->m_invTransformUpdated = false;
  fVar1 = rectangle->width;
  (this->m_center).x = fVar1 * 0.5 + rectangle->left;
  fVar2 = rectangle->height;
  (this->m_center).y = fVar2 * 0.5 + rectangle->top;
  (this->m_size).x = fVar1;
  (this->m_size).y = fVar2;
  this->m_rotation = 0.0;
  this->m_transformUpdated = false;
  this->m_invTransformUpdated = false;
  return;
}

Assistant:

View::View(const FloatRect& rectangle) :
m_center             (),
m_size               (),
m_rotation           (0),
m_viewport           (0, 0, 1, 1),
m_transformUpdated   (false),
m_invTransformUpdated(false)
{
    reset(rectangle);
}